

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O2

CollationCacheEntry * __thiscall
icu_63::CollationLoader::createCacheEntry(CollationLoader *this,UErrorCode *errorCode)

{
  Locale *pLVar1;
  uint uVar2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  CollationCacheEntry *pCVar6;
  Locale *other;
  UResourceBundle *pUVar7;
  UChar *us;
  LocalPointerBase<UResourceBundle> resourceBundle;
  size_t sVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  undefined1 auStack_1d8 [184];
  LocalUResourceBundlePointer LStack_120;
  int iStack_114;
  Locale LStack_110;
  
  if (this->bundle == (UResourceBundle *)0x0) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pLVar1 = &this->locale;
      pcVar11 = Locale::getBaseName(pLVar1);
      pUVar7 = ures_openNoDefault_63("icudt63l-coll",pcVar11,errorCode);
      this->bundle = pUVar7;
      if (*errorCode == U_MISSING_RESOURCE_ERROR) {
        *errorCode = U_USING_DEFAULT_WARNING;
        SharedObject::addRef(&this->rootEntry->super_SharedObject);
        pCVar6 = this->rootEntry;
      }
      else {
        Locale::Locale((Locale *)(LStack_110.script + 4),pLVar1);
        pcVar11 = ures_getLocaleByType_63(this->bundle,ULOC_ACTUAL_LOCALE,errorCode);
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          Locale::Locale((Locale *)auStack_1d8,pcVar11,(char *)0x0,(char *)0x0,(char *)0x0);
          other = Locale::operator=(&this->validLocale,(Locale *)auStack_1d8);
          Locale::operator=(pLVar1,other);
          Locale::~Locale((Locale *)auStack_1d8);
          if (this->type[0] != '\0') {
            Locale::setKeywordValue(pLVar1,"collation",this->type,errorCode);
          }
          UVar3 = Locale::operator!=(pLVar1,(Locale *)(LStack_110.script + 4));
          if (UVar3 == '\0') {
            pCVar6 = loadFromBundle(this,errorCode);
          }
          else {
            pCVar6 = getCacheEntry(this,errorCode);
          }
        }
        else {
          pCVar6 = (CollationCacheEntry *)0x0;
        }
        Locale::~Locale((Locale *)(LStack_110.script + 4));
      }
    }
    else {
      pCVar6 = (CollationCacheEntry *)0x0;
    }
    return pCVar6;
  }
  if (this->collations == (UResourceBundle *)0x0) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pcVar11 = "collations";
      LStack_110.baseName = (char *)0x21ec1c;
      pUVar7 = ures_getByKey_63(this->bundle,"collations",(UResourceBundle *)0x0,errorCode);
      this->collations = pUVar7;
      if (*errorCode == U_MISSING_RESOURCE_ERROR) {
        *errorCode = U_USING_DEFAULT_WARNING;
        pCVar6 = makeCacheEntryFromRoot(this,(Locale *)pcVar11,errorCode);
        return pCVar6;
      }
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        LStack_110._220_4_ = 0;
        LStack_110.baseName = (char *)0x21ec68;
        pUVar7 = ures_getByKeyWithFallback_63
                           (pUVar7,"default",(UResourceBundle *)0x0,
                            (UErrorCode *)&LStack_110.field_0xdc);
        LStack_110.baseName = (char *)0x21ec7b;
        us = ures_getString_63(pUVar7,(int32_t *)&LStack_110.fIsBogus,
                               (UErrorCode *)&LStack_110.field_0xdc);
        pcVar11 = this->defaultType;
        if (LStack_110._216_4_ - 1 < 0xf && (int)LStack_110._220_4_ < 1) {
          LStack_110.baseName = (char *)0x21ecad;
          u_UCharsToChars_63(us,pcVar11,LStack_110._216_4_ + 1);
        }
        else {
          builtin_strncpy(pcVar11,"standard",9);
        }
        LStack_110.baseName = (char *)0x21eccd;
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                  ((LocalUResourceBundlePointer *)&stack0xffffffffffffffd0);
        pcVar12 = this->type;
        if (this->type[0] != '\0') {
          LStack_110.baseName = (char *)0x21ece9;
          iVar4 = strcmp(pcVar12,pcVar11);
          if (iVar4 == 0) {
            *(byte *)&this->typesTried = (byte)this->typesTried | 2;
          }
          LStack_110.baseName = (char *)0x21ed07;
          iVar4 = bcmp(pcVar12,"search",7);
          if (iVar4 == 0) {
            *(byte *)&this->typesTried = (byte)this->typesTried | 1;
          }
          LStack_110.baseName = (char *)0x21ed25;
          iVar4 = bcmp(pcVar12,"standard",9);
          if (iVar4 == 0) {
            *(byte *)&this->typesTried = (byte)this->typesTried | 4;
          }
          LStack_110.baseName = (char *)0x21ed3c;
          pCVar6 = loadFromCollations(this,errorCode);
          return pCVar6;
        }
        LStack_110.baseName = (char *)0x21ed4c;
        strcpy(pcVar12,pcVar11);
        uVar2 = this->typesTried;
        uVar10 = uVar2 | 2;
        this->typesTried = uVar10;
        LStack_110.baseName = (char *)0x21ed72;
        iVar4 = bcmp(pcVar12,"search",7);
        if (iVar4 == 0) {
          uVar10 = uVar2 | 3;
          this->typesTried = uVar10;
        }
        LStack_110.baseName = (char *)0x21ed96;
        iVar4 = bcmp(pcVar12,"standard",9);
        if (iVar4 == 0) {
          this->typesTried = uVar10 | 4;
        }
        LStack_110.baseName = (char *)0x21edbd;
        Locale::setKeywordValue(&this->locale,"collation",pcVar12,errorCode);
        LStack_110.baseName = (char *)0x21edc8;
        pCVar6 = getCacheEntry(this,errorCode);
        return pCVar6;
      }
    }
    return (CollationCacheEntry *)0x0;
  }
  if (this->data != (UResourceBundle *)0x0) {
    pCVar6 = loadFromData(this,errorCode);
    return pCVar6;
  }
  if (U_ZERO_ERROR < *errorCode) {
    return (CollationCacheEntry *)0x0;
  }
  pcVar11 = this->type;
  auStack_1d8[0xa8] = ' ';
  auStack_1d8[0xa9] = -0x12;
  auStack_1d8[0xaa] = '!';
  auStack_1d8[0xab] = '\0';
  auStack_1d8[0xac] = '\0';
  auStack_1d8[0xad] = '\0';
  auStack_1d8[0xae] = '\0';
  auStack_1d8[0xaf] = '\0';
  pcVar12 = pcVar11;
  resourceBundle.ptr =
       ures_getByKeyWithFallback_63(this->collations,pcVar11,(UResourceBundle *)0x0,errorCode);
  LStack_120.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)(LocalPointerBase<UResourceBundle>)resourceBundle.ptr;
  if (*errorCode != U_MISSING_RESOURCE_ERROR) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      LStack_120.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)(UResourceBundle *)0x0;
      this->data = resourceBundle.ptr;
      auStack_1d8[0xa8] = -0x57;
      auStack_1d8[0xa9] = -0x12;
      auStack_1d8[0xaa] = '!';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      pcVar12 = ures_getLocaleByType_63(resourceBundle.ptr,ULOC_ACTUAL_LOCALE,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        pLVar1 = &this->validLocale;
        auStack_1d8[0xa8] = 'N';
        auStack_1d8[0xa9] = -0x11;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pcVar9 = Locale::getBaseName(pLVar1);
        auStack_1d8[0xa8] = 'Y';
        auStack_1d8[0xa9] = -0x11;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        iVar4 = strcmp(pcVar12,pcVar9);
        auStack_1d8[0xa8] = 'j';
        auStack_1d8[0xa9] = -0x11;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        iVar5 = strcmp(pcVar11,this->defaultType);
        if (iVar5 != 0) {
          auStack_1d8[0xa8] = -0x7d;
          auStack_1d8[0xa9] = -0x11;
          auStack_1d8[0xaa] = '!';
          auStack_1d8[0xab] = '\0';
          auStack_1d8[0xac] = '\0';
          auStack_1d8[0xad] = '\0';
          auStack_1d8[0xae] = '\0';
          auStack_1d8[0xaf] = '\0';
          Locale::setKeywordValue(pLVar1,"collation",pcVar11,errorCode);
          if (U_ZERO_ERROR < *errorCode) goto LAB_0021eeb2;
        }
        if (*pcVar12 == '\0') {
LAB_0021efa6:
          pcVar9 = "standard";
          auStack_1d8[0xa8] = -0x48;
          auStack_1d8[0xa9] = -0x11;
          auStack_1d8[0xaa] = '!';
          auStack_1d8[0xab] = '\0';
          auStack_1d8[0xac] = '\0';
          auStack_1d8[0xad] = '\0';
          auStack_1d8[0xae] = '\0';
          auStack_1d8[0xaf] = '\0';
          iVar5 = bcmp(pcVar11,"standard",9);
          if (iVar5 == 0) {
            if (this->typeFallback != '\0') {
              *errorCode = U_USING_DEFAULT_WARNING;
            }
            auStack_1d8[0xa8] = '\\';
            auStack_1d8[0xa9] = -0x10;
            auStack_1d8[0xaa] = '!';
            auStack_1d8[0xab] = '\0';
            auStack_1d8[0xac] = '\0';
            auStack_1d8[0xad] = '\0';
            auStack_1d8[0xae] = '\0';
            auStack_1d8[0xaf] = '\0';
            pCVar6 = makeCacheEntryFromRoot(this,(Locale *)pcVar9,errorCode);
            goto LAB_0021ef20;
          }
        }
        else {
          auStack_1d8[0xa8] = -0x5e;
          auStack_1d8[0xa9] = -0x11;
          auStack_1d8[0xaa] = '!';
          auStack_1d8[0xab] = '\0';
          auStack_1d8[0xac] = '\0';
          auStack_1d8[0xad] = '\0';
          auStack_1d8[0xae] = '\0';
          auStack_1d8[0xaf] = '\0';
          iVar5 = strcmp(pcVar12,"root");
          if (iVar5 == 0) goto LAB_0021efa6;
        }
        auStack_1d8[0xa8] = -0x28;
        auStack_1d8[0xa9] = -0x11;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        iStack_114 = iVar4;
        Locale::Locale(&LStack_110,pcVar12,(char *)0x0,(char *)0x0,(char *)0x0);
        auStack_1d8[0xa8] = -0x11;
        auStack_1d8[0xa9] = -0x11;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        Locale::operator=(&this->locale,&LStack_110);
        auStack_1d8[0xa8] = -9;
        auStack_1d8[0xa9] = -0x11;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        Locale::~Locale(&LStack_110);
        if (iStack_114 == 0) {
          auStack_1d8[0xa8] = '<';
          auStack_1d8[0xa9] = -0x10;
          auStack_1d8[0xaa] = '!';
          auStack_1d8[0xab] = '\0';
          auStack_1d8[0xac] = '\0';
          auStack_1d8[0xad] = '\0';
          auStack_1d8[0xae] = '\0';
          auStack_1d8[0xaf] = '\0';
          pCVar6 = loadFromData(this,errorCode);
        }
        else {
          auStack_1d8[0xa8] = '\x13';
          auStack_1d8[0xa9] = -0x10;
          auStack_1d8[0xaa] = '!';
          auStack_1d8[0xab] = '\0';
          auStack_1d8[0xac] = '\0';
          auStack_1d8[0xad] = '\0';
          auStack_1d8[0xae] = '\0';
          auStack_1d8[0xaf] = '\0';
          Locale::setKeywordValue(&this->locale,"collation",pcVar11,errorCode);
          auStack_1d8[0xa8] = '\x1e';
          auStack_1d8[0xa9] = -0x10;
          auStack_1d8[0xaa] = '!';
          auStack_1d8[0xab] = '\0';
          auStack_1d8[0xac] = '\0';
          auStack_1d8[0xad] = '\0';
          auStack_1d8[0xae] = '\0';
          auStack_1d8[0xaf] = '\0';
          pCVar6 = getCacheEntry(this,errorCode);
          auStack_1d8[0xa8] = ',';
          auStack_1d8[0xa9] = -0x10;
          auStack_1d8[0xaa] = '!';
          auStack_1d8[0xab] = '\0';
          auStack_1d8[0xac] = '\0';
          auStack_1d8[0xad] = '\0';
          auStack_1d8[0xae] = '\0';
          auStack_1d8[0xaf] = '\0';
          pCVar6 = makeCacheEntry(pLVar1,pCVar6,errorCode);
        }
        goto LAB_0021ef20;
      }
    }
LAB_0021eeb2:
    pCVar6 = (CollationCacheEntry *)0x0;
    goto LAB_0021ef20;
  }
  auStack_1d8[0xa8] = '4';
  auStack_1d8[0xa9] = -0x12;
  auStack_1d8[0xaa] = '!';
  auStack_1d8[0xab] = '\0';
  auStack_1d8[0xac] = '\0';
  auStack_1d8[0xad] = '\0';
  auStack_1d8[0xae] = '\0';
  auStack_1d8[0xaf] = '\0';
  sVar8 = strlen(pcVar11);
  *errorCode = U_USING_DEFAULT_WARNING;
  this->typeFallback = '\x01';
  uVar2 = this->typesTried;
  if (((uVar2 & 1) == 0) && (6 < (int)sVar8)) {
    pcVar12 = "search";
    auStack_1d8[0xa8] = 'f';
    auStack_1d8[0xa9] = -0x12;
    auStack_1d8[0xaa] = '!';
    auStack_1d8[0xab] = '\0';
    auStack_1d8[0xac] = '\0';
    auStack_1d8[0xad] = '\0';
    auStack_1d8[0xae] = '\0';
    auStack_1d8[0xaf] = '\0';
    iVar4 = bcmp(pcVar11,"search",6);
    if (iVar4 != 0) goto LAB_0021ee6a;
    this->typesTried = uVar2 | 1;
    this->type[6] = '\0';
  }
  else {
LAB_0021ee6a:
    if ((uVar2 & 2) == 0) {
      this->typesTried = uVar2 | 2;
      auStack_1d8[0xa8] = -0x77;
      auStack_1d8[0xa9] = -0x12;
      auStack_1d8[0xaa] = '!';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      strcpy(pcVar11,this->defaultType);
    }
    else {
      if ((uVar2 & 4) != 0) {
        auStack_1d8[0xa8] = -0x1b;
        auStack_1d8[0xa9] = -0x12;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pCVar6 = makeCacheEntryFromRoot(this,(Locale *)pcVar12,errorCode);
        goto LAB_0021ef20;
      }
      this->typesTried = uVar2 | 4;
      builtin_strncpy(pcVar11,"standard",9);
    }
  }
  auStack_1d8[0xa8] = '\x12';
  auStack_1d8[0xa9] = -0x11;
  auStack_1d8[0xaa] = '!';
  auStack_1d8[0xab] = '\0';
  auStack_1d8[0xac] = '\0';
  auStack_1d8[0xad] = '\0';
  auStack_1d8[0xae] = '\0';
  auStack_1d8[0xaf] = '\0';
  Locale::setKeywordValue(&this->locale,"collation",pcVar11,errorCode);
  auStack_1d8[0xa8] = '\x1d';
  auStack_1d8[0xa9] = -0x11;
  auStack_1d8[0xaa] = '!';
  auStack_1d8[0xab] = '\0';
  auStack_1d8[0xac] = '\0';
  auStack_1d8[0xad] = '\0';
  auStack_1d8[0xae] = '\0';
  auStack_1d8[0xaf] = '\0';
  pCVar6 = getCacheEntry(this,errorCode);
LAB_0021ef20:
  auStack_1d8[0xa8] = '*';
  auStack_1d8[0xa9] = -0x11;
  auStack_1d8[0xaa] = '!';
  auStack_1d8[0xab] = '\0';
  auStack_1d8[0xac] = '\0';
  auStack_1d8[0xad] = '\0';
  auStack_1d8[0xae] = '\0';
  auStack_1d8[0xaf] = '\0';
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&LStack_120);
  return pCVar6;
}

Assistant:

const CollationCacheEntry *
CollationLoader::createCacheEntry(UErrorCode &errorCode) {
    // This is a linear lookup and fallback flow turned into a state machine.
    // Most local variables have been turned into instance fields.
    // In a cache miss, cache.get() calls CacheKey::createObject(),
    // which means that we progress via recursion.
    // loadFromCollations() will recurse to itself as well for collation type fallback.
    if(bundle == NULL) {
        return loadFromLocale(errorCode);
    } else if(collations == NULL) {
        return loadFromBundle(errorCode);
    } else if(data == NULL) {
        return loadFromCollations(errorCode);
    } else {
        return loadFromData(errorCode);
    }
}